

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall
ON_Xform::DecomposeAffine(ON_Xform *this,ON_3dVector *T,ON_Xform *R,ON_Xform *Q,ON_3dVector *lambda)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  ON_Xform *pOVar10;
  ON_3dVector *pOVar11;
  ON_Xform *pOVar12;
  byte bVar13;
  double dVar14;
  ON_3dVector local_3b0 [5];
  ON_Xform local_330;
  ON_Xform L;
  ON_Xform Diag;
  ON_Xform QT;
  ON_Xform LTL;
  ON_Xform LT;
  
  bVar13 = 0;
  bVar6 = IsAffine(this);
  if (bVar6) {
    ON_Xform(&L);
    DecomposeAffine(this,T,&L);
    pOVar10 = &L;
    pOVar12 = &LT;
    for (lVar8 = 0x10; dVar5 = LT.m_xform[2][3], dVar4 = LT.m_xform[1][3], dVar3 = LT.m_xform[1][2],
        dVar2 = LT.m_xform[0][3], dVar1 = LT.m_xform[0][2], dVar14 = LT.m_xform[0][1], lVar8 != 0;
        lVar8 = lVar8 + -1) {
      pOVar12->m_xform[0][0] = pOVar10->m_xform[0][0];
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    LT.m_xform[0][1] = LT.m_xform[1][0];
    LT.m_xform[1][0] = dVar14;
    LT.m_xform[0][2] = LT.m_xform[2][0];
    LT.m_xform[2][0] = dVar1;
    LT.m_xform[0][3] = LT.m_xform[3][0];
    LT.m_xform[3][0] = dVar2;
    LT.m_xform[1][2] = LT.m_xform[2][1];
    LT.m_xform[2][1] = dVar3;
    LT.m_xform[1][3] = LT.m_xform[3][1];
    LT.m_xform[3][1] = dVar4;
    LT.m_xform[2][3] = LT.m_xform[3][2];
    LT.m_xform[3][2] = dVar5;
    operator*(&LTL,&LT,&L);
    bVar6 = DecomposeSymmetric(&LTL,Q,lambda);
    if (bVar6) {
      pdVar7 = ON_3dVector::operator[](lambda,0);
      if (*pdVar7 <= 0.0) {
        return false;
      }
      pdVar7 = ON_3dVector::operator[](lambda,1);
      if ((0.0 < *pdVar7) && (pdVar7 = ON_3dVector::operator[](lambda,2), 0.0 < *pdVar7)) {
        pdVar7 = ON_3dVector::operator[](lambda,0);
        dVar14 = *pdVar7;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        pdVar7 = ON_3dVector::operator[](lambda,0);
        *pdVar7 = dVar14;
        pdVar7 = ON_3dVector::operator[](lambda,1);
        dVar14 = *pdVar7;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        pdVar7 = ON_3dVector::operator[](lambda,1);
        *pdVar7 = dVar14;
        pdVar7 = ON_3dVector::operator[](lambda,2);
        dVar14 = *pdVar7;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        pdVar7 = ON_3dVector::operator[](lambda,2);
        *pdVar7 = dVar14;
        lVar8 = 0x10;
        pOVar10 = Q;
        pOVar12 = &QT;
        for (lVar9 = lVar8; dVar5 = QT.m_xform[2][3], dVar4 = QT.m_xform[1][3],
            dVar3 = QT.m_xform[1][2], dVar2 = QT.m_xform[0][3], dVar1 = QT.m_xform[0][2],
            dVar14 = QT.m_xform[0][1], lVar9 != 0; lVar9 = lVar9 + -1) {
          pOVar12->m_xform[0][0] = pOVar10->m_xform[0][0];
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
          pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        QT.m_xform[0][1] = QT.m_xform[1][0];
        QT.m_xform[1][0] = dVar14;
        QT.m_xform[0][2] = QT.m_xform[2][0];
        QT.m_xform[2][0] = dVar1;
        QT.m_xform[0][3] = QT.m_xform[3][0];
        QT.m_xform[3][0] = dVar2;
        QT.m_xform[1][2] = QT.m_xform[2][1];
        QT.m_xform[2][1] = dVar3;
        QT.m_xform[1][3] = QT.m_xform[3][1];
        QT.m_xform[3][1] = dVar4;
        QT.m_xform[2][3] = QT.m_xform[3][2];
        QT.m_xform[3][2] = dVar5;
        pdVar7 = ON_3dVector::operator[](lambda,0);
        dVar14 = *pdVar7;
        pdVar7 = ON_3dVector::operator[](lambda,1);
        dVar1 = *pdVar7;
        pdVar7 = ON_3dVector::operator[](lambda,2);
        Diag.m_xform[2][2] = 1.0 / *pdVar7;
        pOVar10 = &IdentityTransformation;
        pOVar12 = &Diag;
        for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
          pOVar12->m_xform[0][0] = pOVar10->m_xform[0][0];
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
          pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        Diag.m_xform[0][0] = 1.0 / dVar14;
        Diag.m_xform[1][1] = 1.0 / dVar1;
        operator*(&local_330,Q,&Diag);
        operator*((ON_Xform *)local_3b0,&local_330,&QT);
        pOVar11 = local_3b0;
        pOVar10 = R;
        for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
          pOVar10->m_xform[0][0] = (*(double (*) [4])&pOVar11->x)[0];
          pOVar11 = (ON_3dVector *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        operator*((ON_Xform *)local_3b0,&L,R);
        pOVar11 = local_3b0;
        pOVar10 = R;
        for (; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar10->m_xform[0][0] = (*(double (*) [4])&pOVar11->x)[0];
          pOVar11 = (ON_3dVector *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        dVar14 = Determinant(R,(double *)0x0);
        if (dVar14 < 0.0) {
          ON_Xform(&local_330,-1.0);
          operator*((ON_Xform *)local_3b0,&local_330,R);
          pOVar11 = local_3b0;
          pOVar10 = R;
          for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pOVar10->m_xform[0][0] = (*(double (*) [4])&pOVar11->x)[0];
            pOVar11 = (ON_3dVector *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
            pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
          }
          ::operator*(local_3b0,-1,lambda);
          lambda->z = local_3b0[0].z;
          lambda->x = local_3b0[0].x;
          lambda->y = local_3b0[0].y;
        }
        Orthogonalize(R,2.3283064365386963e-10);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Xform::DecomposeAffine(ON_3dVector& T, ON_Xform& R,
	ON_Xform& Q, ON_3dVector& lambda) const
{
	bool rc = false;
	if (IsAffine())
	{
		ON_Xform L;
		DecomposeAffine(T, L);
		ON_Xform LT = L;
		LT.Transpose();
		ON_Xform LTL = LT * L;

		rc = LTL.DecomposeSymmetric(Q, lambda);
		if (rc)
		{
			rc = (lambda[0] > 0 && lambda[1] > 0 && lambda[2] > 0);
			if(rc)
			{
				lambda[0] = sqrt(lambda[0]);
				lambda[1] = sqrt(lambda[1]);
				lambda[2] = sqrt(lambda[2]);
				ON_Xform QT = Q;
				QT.Transpose();
				ON_Xform Diag = ON_Xform::DiagonalTransformation(1.0 / lambda[0], 1.0 / lambda[1], 1.0 / lambda[2]);
				R = Q * Diag * QT;
				R = L * R;

				if (R.Determinant() < 0)
				{
					R = ON_Xform(-1) * R;
					lambda = -1 * lambda;
				}
				R.Orthogonalize(ON_ZERO_TOLERANCE);  // tune it up - tol should be <= that in 
																							// Is_Rotation()
			}
		}
	}
	return rc;
}